

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O3

void __thiscall
luna::CodeGenerateVisitor::Visit
          (CodeGenerateVisitor *this,LocalNameListStatement *l_namelist_stmt,void *data)

{
  uint uVar1;
  SyntaxTree *pSVar2;
  uint uVar3;
  ExpListData_conflict exp_list_data;
  NameListData_conflict name_list_data;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48 [2];
  
  if ((l_namelist_stmt->exp_list_)._M_t.
      super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
      super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
      super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == (SyntaxTree *)0x0) {
    local_48[0]._0_1_ = true;
  }
  else {
    uVar1 = this->current_function_->register_id_;
    uVar3 = (int)l_namelist_stmt->name_count_ + uVar1;
    local_88._12_4_ = 0;
    local_88._8_4_ = uVar3;
    local_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1135:21)>
               ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1135:21)>
               ::_M_manager;
    local_68._12_4_ = 0;
    local_68._8_4_ = uVar1;
    local_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1136:21)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1136:21)>
               ::_M_manager;
    local_88._M_unused._M_object = this;
    local_68._M_unused._M_object = this;
    Guard::Guard((Guard *)local_48,(function<void_()> *)&local_88,(function<void_()> *)&local_68);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    local_88._4_4_ = uVar3;
    local_88._0_4_ = uVar1;
    pSVar2 = (l_namelist_stmt->exp_list_)._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this);
    Guard::~Guard((Guard *)local_48);
    local_48[0]._0_1_ =
         (l_namelist_stmt->exp_list_)._M_t.
         super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
         super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == (SyntaxTree *)0x0;
  }
  pSVar2 = (l_namelist_stmt->name_list_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(LocalNameListStatement *l_namelist_stmt, void *data)
    {
        // Generate code for expression list first, then expression list can get
        // variables which has the same name with variables defined in NameList
        // e.g.
        //     local i = 1
        //     local i = i -- i value is 1
        if (l_namelist_stmt->exp_list_)
        {
            // Reserve registers for NameList
            int start_register = GetNextRegisterId();
            int end_register = start_register + l_namelist_stmt->name_count_;
            Guard g([=]() { this->ResetRegisterIdGenerator(end_register); },
                    [=]() { this->ResetRegisterIdGenerator(start_register); });

            try
            {
                ExpListData exp_list_data{ start_register, end_register };
                l_namelist_stmt->exp_list_->Accept(this, &exp_list_data);
            }
            catch (const CodeGenerateException &)
            {
                throw CodeGenerateException(
                    GetCurrentFunction()->GetModule()->GetCStr(),
                    l_namelist_stmt->line_,
                    "expression of local name list is too complex");
            }
        }

        // NameList need init itself when ExpList is not existed
        NameListData name_list_data{ !l_namelist_stmt->exp_list_ };
        l_namelist_stmt->name_list_->Accept(this, &name_list_data);
    }